

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_buffering.c
# Opt level: O0

uint64_t bigendian_decode_u64(uint8_t *bytes)

{
  uint64_t value;
  uint8_t *bytes_local;
  
  return (ulong)bytes[7] |
         (ulong)bytes[6] << 8 |
         (ulong)bytes[5] << 0x10 |
         (ulong)bytes[4] << 0x18 |
         (ulong)bytes[3] << 0x20 |
         (ulong)bytes[2] << 0x28 | (ulong)bytes[1] << 0x30 | (ulong)*bytes << 0x38;
}

Assistant:

ASCON_INLINE uint64_t
bigendian_decode_u64(const uint8_t* const bytes)
{
    uint64_t value = 0;
    value |= ((uint64_t) bytes[0]) << 56U;
    value |= ((uint64_t) bytes[1]) << 48U;
    value |= ((uint64_t) bytes[2]) << 40U;
    value |= ((uint64_t) bytes[3]) << 32U;
    value |= ((uint64_t) bytes[4]) << 24U;
    value |= ((uint64_t) bytes[5]) << 16U;
    value |= ((uint64_t) bytes[6]) << 8U;
    value |= ((uint64_t) bytes[7]);
    return value;
}